

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

crypto_word_t CRYPTO_load_word_be(void *in)

{
  uint64_t uVar1;
  uint64_t local_18;
  crypto_word_t v;
  void *in_local;
  
  v = (crypto_word_t)in;
  OPENSSL_memcpy(&local_18,in,8);
  uVar1 = CRYPTO_bswap8(local_18);
  return uVar1;
}

Assistant:

static inline crypto_word_t CRYPTO_load_word_be(const void *in) {
  crypto_word_t v;
  OPENSSL_memcpy(&v, in, sizeof(v));
#if defined(OPENSSL_64_BIT)
  static_assert(sizeof(v) == 8, "crypto_word_t has unexpected size");
  return CRYPTO_bswap8(v);
#else
  static_assert(sizeof(v) == 4, "crypto_word_t has unexpected size");
  return CRYPTO_bswap4(v);
#endif
}